

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O3

CURLcode smtp_setup_connection(connectdata *conn)

{
  char **ppcVar1;
  Curl_easy *pCVar2;
  CURLcode CVar3;
  void *pvVar4;
  Curl_easy *data;
  
  pCVar2 = conn->data;
  conn->tls_upgraded = false;
  pvVar4 = (*Curl_ccalloc)(0x28,1);
  (pCVar2->req).protop = pvVar4;
  if (pvVar4 == (void *)0x0) {
    CVar3 = CURLE_OUT_OF_MEMORY;
  }
  else {
    ppcVar1 = &(pCVar2->state).path;
    *ppcVar1 = *ppcVar1 + 1;
    CVar3 = CURLE_OK;
  }
  return CVar3;
}

Assistant:

static CURLcode smtp_setup_connection(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  CURLcode result;

  /* Clear the TLS upgraded flag */
  conn->tls_upgraded = FALSE;

  /* Initialise the SMTP layer */
  result = smtp_init(conn);
  if(result)
    return result;

  data->state.path++;   /* don't include the initial slash */

  return CURLE_OK;
}